

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,int down)

{
  float fVar1;
  ulong uVar2;
  uint uVar3;
  nk_rect bounds;
  nk_rect local_28;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x48c3,
                  "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
  }
  if (ctx->current != (nk_window *)0x0) {
    uVar2 = (ulong)btn;
    nk_layout_peek(&local_28,ctx);
    uVar3 = 0;
    if (ctx->active == ctx->current) {
      fVar1 = *(float *)((long)(ctx->style).cursors + uVar2 * 0x10 + -0x54);
      if ((local_28.x <= fVar1) && (fVar1 <= local_28.x + local_28.w)) {
        fVar1 = *(float *)((ctx->style).cursors + uVar2 * 2 + -10);
        if ((local_28.y <= fVar1) && (fVar1 <= local_28.y + local_28.h)) {
          uVar3 = (uint)((ctx->input).mouse.buttons[uVar2].down == down);
        }
      }
    }
    return uVar3;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x48c4,
                "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
}

Assistant:

NK_API int
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, int down)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
    return ret;
}